

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookmem_02.cpp
# Opt level: O0

int test1(void)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  void *pvVar4;
  void *ptr;
  undefined1 local_288 [8];
  SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> memCtx;
  
  cookmem::SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
  SimpleMemContext((SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                   local_288,false);
  bVar1 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
          isStoringExactSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                             &memCtx.
                              super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                              .field_0x10);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1c);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool._580_4_ =
         1;
  }
  else {
    sVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getSize
                      ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                       &memCtx.
                        super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>.
                        field_0x10,(void *)0x0);
    if (sVar3 == 0) {
      pvVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                         ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                          &memCtx.
                           super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                           .field_0x10,0x1e);
      if (pvVar4 == (void *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x23);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
        _580_4_ = 1;
      }
      else {
        sVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getSize
                          ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                           &memCtx.
                            super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                            .field_0x10,pvVar4);
        if (sVar3 == 0x20) {
          cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
                    ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                     &memCtx.
                      super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>.
                      field_0x10,pvVar4,0);
          sVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                  getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                          &memCtx.
                           super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                           .field_0x10,pvVar4);
          if (sVar3 == 0) {
            pvVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                     allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                              &memCtx.
                               super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                               .field_0x10,300);
            if (pvVar4 == (void *)0x0) {
              poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x29);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool
              ._580_4_ = 1;
            }
            else {
              sVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                      getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                              &memCtx.
                               super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                               .field_0x10,pvVar4);
              if (sVar3 == 0x130) {
                pvVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                         ::allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                     *)&memCtx.
                                        super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                        .field_0x10,3000);
                if (pvVar4 == (void *)0x0) {
                  poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2c);
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                  m_pool._580_4_ = 1;
                }
                else {
                  sVar3 = cookmem::
                          MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                          getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                   *)&memCtx.
                                      super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                      .field_0x10,pvVar4);
                  if (sVar3 == 0xbc0) {
                    pvVar4 = cookmem::
                             MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                             allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                       *)&memCtx.
                                          super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                          .field_0x10,30000);
                    if (pvVar4 == (void *)0x0) {
                      poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2f);
                      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                      memCtx.
                      super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                      m_pool._580_4_ = 1;
                    }
                    else {
                      sVar3 = cookmem::
                              MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                              getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                       *)&memCtx.
                                          super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                          .field_0x10,pvVar4);
                      if (sVar3 == 30000) {
                        pvVar4 = cookmem::
                                 MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                 ::allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                             *)&memCtx.
                                                super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                                .field_0x10,30000);
                        sVar3 = cookmem::
                                MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                                getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                         *)&memCtx.
                                            super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                            .field_0x10,pvVar4);
                        if (sVar3 == 30000) {
                          if (pvVar4 == (void *)0x0) {
                            poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
                            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                            memCtx.
                            super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                            .m_pool._580_4_ = 1;
                          }
                          else {
                            pvVar4 = cookmem::
                                     MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                     ::allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                 *)&memCtx.
                                                  super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                                  .field_0x10,30000);
                            sVar3 = cookmem::
                                    MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                    ::getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                               *)&memCtx.
                                                  super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                                  .field_0x10,pvVar4);
                            if (sVar3 == 30000) {
                              if (pvVar4 == (void *)0x0) {
                                poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x36);
                                std::ostream::operator<<
                                          (poVar2,std::endl<char,std::char_traits<char>>);
                                memCtx.
                                super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                .m_pool._580_4_ = 1;
                              }
                              else {
                                memCtx.
                                super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                .m_pool._580_4_ = 0;
                              }
                            }
                            else {
                              poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
                              std::ostream::operator<<
                                        (poVar2,std::endl<char,std::char_traits<char>>);
                              memCtx.
                              super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                              .m_pool._580_4_ = 1;
                            }
                          }
                        }
                        else {
                          poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
                          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                          memCtx.
                          super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                          m_pool._580_4_ = 1;
                        }
                      }
                      else {
                        poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x30);
                        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                        memCtx.
                        super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                        m_pool._580_4_ = 1;
                      }
                    }
                  }
                  else {
                    poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2d);
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                    m_pool._580_4_ = 1;
                  }
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2a);
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                m_pool._580_4_ = 1;
              }
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x26);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
            _580_4_ = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x24);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
          _580_4_ = 1;
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1e);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool._580_4_
           = 1;
    }
  }
  cookmem::SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
  ~SimpleMemContext((SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                    local_288);
  return memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
         _580_4_;
}

Assistant:

static int
test1 ()
{
    cookmem::SimpleMemContext<cookmem::MallocArena> memCtx;

    ASSERT_EQ (false, memCtx.isStoringExactSize ());

    ASSERT_EQ (0, memCtx.getSize (nullptr));

    void* ptr;

    ptr = memCtx.allocate (30);
    ASSERT_NE (nullptr, ptr);
    ASSERT_EQ (32, memCtx.getSize (ptr));
    memCtx.deallocate (ptr);
    ASSERT_EQ (0, memCtx.getSize (ptr));

    ptr = memCtx.allocate (300);
    ASSERT_NE (nullptr, ptr);
    ASSERT_EQ (304, memCtx.getSize (ptr));
    ptr = memCtx.allocate (3000);
    ASSERT_NE (nullptr, ptr);
    ASSERT_EQ (3008, memCtx.getSize (ptr));
    ptr = memCtx.allocate (30000);
    ASSERT_NE (nullptr, ptr);
    ASSERT_EQ (30000, memCtx.getSize (ptr));
    ptr = memCtx.allocate (30000);
    ASSERT_EQ (30000, memCtx.getSize (ptr));
    ASSERT_NE (nullptr, ptr);
    ptr = memCtx.allocate (30000);
    ASSERT_EQ (30000, memCtx.getSize (ptr));
    ASSERT_NE (nullptr, ptr);

    return 0;
}